

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcreteVisitor.hh
# Opt level: O0

shared_ptr<VisitorResult> __thiscall ConcreteVisitor::visit(ConcreteVisitor *this,ASTFrom *from)

{
  bool bVar1;
  vector<ASTCollectionIdentifier,_std::allocator<ASTCollectionIdentifier>_> *this_00;
  reference this_01;
  string *__x;
  element_type *this_02;
  ASTFrom *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<VisitorResult> sVar2;
  ASTCollectionIdentifier *coll;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ASTCollectionIdentifier,_std::allocator<ASTCollectionIdentifier>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  colls;
  shared_ptr<LogicalJoin> lj;
  ASTFrom *from_local;
  ConcreteVisitor *this_local;
  
  std::make_shared<LogicalJoin>();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  this_00 = ASTFrom::getCollections(in_RDX);
  __end1 = std::vector<ASTCollectionIdentifier,_std::allocator<ASTCollectionIdentifier>_>::begin
                     (this_00);
  coll = (ASTCollectionIdentifier *)
         std::vector<ASTCollectionIdentifier,_std::allocator<ASTCollectionIdentifier>_>::end
                   (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_ASTCollectionIdentifier_*,_std::vector<ASTCollectionIdentifier,_std::allocator<ASTCollectionIdentifier>_>_>
                                *)&coll);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_ASTCollectionIdentifier_*,_std::vector<ASTCollectionIdentifier,_std::allocator<ASTCollectionIdentifier>_>_>
              ::operator*(&__end1);
    __x = ASTCollectionIdentifier::getName_abi_cxx11_(this_01);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,__x);
    __gnu_cxx::
    __normal_iterator<const_ASTCollectionIdentifier_*,_std::vector<ASTCollectionIdentifier,_std::allocator<ASTCollectionIdentifier>_>_>
    ::operator++(&__end1);
  }
  this_02 = std::__shared_ptr_access<LogicalJoin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<LogicalJoin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&colls.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  LogicalJoin::setCollections
            (this_02,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
  std::shared_ptr<VisitorResult>::shared_ptr<LogicalJoin,void>
            ((shared_ptr<VisitorResult> *)this,
             (shared_ptr<LogicalJoin> *)
             &colls.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::shared_ptr<LogicalJoin>::~shared_ptr
            ((shared_ptr<LogicalJoin> *)
             &colls.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<VisitorResult>)
         sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VisitorResult> visit(ASTFrom *from) override {
        auto lj = std::make_shared<LogicalJoin>();
        std::vector<std::string> colls;
        for (auto &coll: from->getCollections()) {
            colls.push_back(coll.getName());
        }
        lj->setCollections(colls);
        return lj;
    }